

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDual.cpp
# Opt level: O1

void __thiscall HDual::setEdWt(HDual *this,char *EdWt_ArgV)

{
  int iVar1;
  size_t sVar2;
  
  iVar1 = strcmp(EdWt_ArgV,"Dan");
  if (iVar1 == 0) {
    this->EdWt_Mode = 2;
  }
  else {
    iVar1 = strcmp(EdWt_ArgV,"Dvx");
    if (iVar1 == 0) {
      this->EdWt_Mode = 1;
    }
    else {
      iVar1 = strcmp(EdWt_ArgV,"DSE");
      if (iVar1 != 0) {
        iVar1 = strcmp(EdWt_ArgV,"DSE0");
        if (iVar1 == 0) {
          this->EdWt_Mode = 0;
          this->iz_DSE_wt = false;
          return;
        }
        iVar1 = strcmp(EdWt_ArgV,"DSE1");
        if (iVar1 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"HDual::setEdWt unrecognised EdWtArgV = ",0x27);
          if (EdWt_ArgV == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x16a200);
          }
          else {
            sVar2 = strlen(EdWt_ArgV);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,EdWt_ArgV,sVar2);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout," - using DSE with exact initial weights",0x27);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
          std::ostream::put('\0');
          std::ostream::flush();
        }
      }
      this->EdWt_Mode = 0;
      this->iz_DSE_wt = true;
    }
  }
  return;
}

Assistant:

void HDual::setEdWt(const char *EdWt_ArgV) {
  //	cout<<"HDual::setEdWt EdWt_ArgV = "<<EdWt_ArgV<<endl;
	if (strcmp(EdWt_ArgV, "Dan") == 0)
		EdWt_Mode = EdWt_Mode_Dan;
	else if (strcmp(EdWt_ArgV, "Dvx") == 0)
		EdWt_Mode = EdWt_Mode_Dvx;
	else if (strcmp(EdWt_ArgV, "DSE") == 0)
		{EdWt_Mode = EdWt_Mode_DSE; iz_DSE_wt = true;}
	else if (strcmp(EdWt_ArgV, "DSE0") == 0)
		{EdWt_Mode = EdWt_Mode_DSE; iz_DSE_wt = false;}
	else if (strcmp(EdWt_ArgV, "DSE1") == 0)
	{EdWt_Mode = EdWt_Mode_DSE; iz_DSE_wt = true;}
	else {
	  cout << "HDual::setEdWt unrecognised EdWtArgV = " << EdWt_ArgV
	       << " - using DSE with exact initial weights" << endl;
	  EdWt_Mode = EdWt_Mode_DSE; iz_DSE_wt = true;
	}
	//	cout<<"HDual::setEdWt iz_DSE_wt = " << iz_DSE_wt << endl;
}